

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

void testing::internal::
     GenerateNamesRecursively<testing::internal::DefaultNameGenerator,testing::internal::Types<yamc::fair::basic_shared_mutex<yamc::rwlock::PhaseFairness>,std::mutex,yamc::alternate::timed_mutex,yamc::alternate::basic_shared_mutex<yamc::rwlock::ReaderPrefer>,yamc::posix::native_mutex,yamc::posix::rwlock,yamc::posix::native_mutex>>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *param_1,uint param_2,int param_3)

{
  string local_40;
  uint local_1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  int i_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result_local;
  
  local_1c = param_2;
  pvStack_18 = param_1;
  DefaultNameGenerator::GetName<yamc::fair::basic_shared_mutex<yamc::rwlock::PhaseFairness>>
            (&local_40,(DefaultNameGenerator *)(ulong)param_2,param_3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(param_1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  GenerateNamesRecursively<testing::internal::DefaultNameGenerator,testing::internal::Types<std::mutex,yamc::alternate::timed_mutex,yamc::alternate::basic_shared_mutex<yamc::rwlock::ReaderPrefer>,yamc::posix::native_mutex,yamc::posix::rwlock,yamc::posix::native_mutex>>
            (pvStack_18,local_1c + 1);
  return;
}

Assistant:

void GenerateNamesRecursively(Types, std::vector<std::string>* result, int i) {
  result->push_back(NameGenerator::template GetName<typename Types::Head>(i));
  GenerateNamesRecursively<NameGenerator>(typename Types::Tail(), result,
                                          i + 1);
}